

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManFirstFanouts(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  int iVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar1 = p->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  uVar2 = p->nObjs;
  if ((0 < (int)uVar2) && (pGVar7 = p->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
    uVar8 = 0;
    do {
      uVar11 = (uint)*(ulong *)pGVar7;
      uVar10 = *(ulong *)pGVar7 & 0x1fffffff;
      iVar6 = (int)uVar8;
      if (uVar10 == 0x1fffffff || (int)uVar11 < 0) {
        if ((int)uVar11 < 0 && (int)uVar10 != 0x1fffffff) {
          uVar10 = -(uVar11 & 0x1fffffff) + uVar8;
          iVar9 = (int)uVar10;
          if ((iVar9 < 0) || (iVar1 <= iVar9)) goto LAB_00245307;
          uVar10 = uVar10 & 0xffffffff;
          if (__s[uVar10] == 0) {
LAB_002452e1:
            __s[uVar10] = iVar6;
          }
        }
      }
      else {
        uVar10 = -(uVar11 & 0x1fffffff) + uVar8;
        iVar9 = (int)uVar10;
        if ((iVar9 < 0) || (iVar1 <= iVar9)) {
LAB_00245307:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar10 = uVar10 & 0xffffffff;
        if (__s[uVar10] == 0) {
          __s[uVar10] = iVar6;
        }
        uVar10 = -(*(uint *)&pGVar7->field_0x4 & 0x1fffffff) + uVar8;
        iVar9 = (int)uVar10;
        if ((iVar9 < 0) || (iVar1 <= iVar9)) goto LAB_00245307;
        uVar10 = uVar10 & 0xffffffff;
        if (__s[uVar10] == 0) {
          __s[uVar10] = iVar6;
        }
        puVar4 = p->pMuxes;
        if ((puVar4 != (uint *)0x0) && (puVar4[uVar8] != 0)) {
          uVar11 = 0xffffffff;
          if (puVar4 != (uint *)0x0) {
            uVar3 = puVar4[uVar8];
            if (uVar3 != 0) {
              if ((int)uVar3 < 0) goto LAB_00245326;
              uVar11 = uVar3 >> 1;
            }
          }
          if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_00245307;
          if (__s[uVar11] == 0) {
            uVar11 = 0xffffffff;
            if (puVar4 != (uint *)0x0) {
              uVar3 = puVar4[uVar8];
              if (uVar3 != 0) {
                if ((int)uVar3 < 0) {
LAB_00245326:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar11 = uVar3 >> 1;
              }
            }
            if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar10 = (ulong)uVar11;
            goto LAB_002452e1;
          }
        }
      }
      uVar8 = uVar8 + 1;
      pGVar7 = pGVar7 + 1;
    } while (uVar2 != uVar8);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManFirstFanouts( Gia_Man_t * p )
{
    Vec_Int_t * vFans = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId1p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId1p(p, pObj), i);
            if ( Gia_ObjIsMuxId(p, i) && Vec_IntEntry(vFans, Gia_ObjFaninId2p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId2p(p, pObj), i);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
        }
    }
    return vFans;
}